

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensors.cpp
# Opt level: O0

void __thiscall
iDynTree::SensorsList::Iterator::Iterator
          (Iterator *this,
          vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
          *list)

{
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  Sensor **in_RSI;
  __normal_iterator<iDynTree::Sensor_**,_std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>
  *in_RDI;
  vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_> *in_stack_ffffffffffffffa8;
  __normal_iterator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_*,_std::vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>_>
  *in_stack_ffffffffffffffb0;
  __normal_iterator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_*,_std::vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>_>
  *__lhs;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 uVar4;
  
  __gnu_cxx::
  __normal_iterator<iDynTree::Sensor_**,_std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>
  ::__normal_iterator(in_RDI);
  __gnu_cxx::
  __normal_iterator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_*,_std::vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>_>
  ::__normal_iterator((__normal_iterator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_*,_std::vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>_>
                       *)(in_RDI + 1));
  in_RDI[2]._M_current = in_RSI;
  iVar2 = std::
          vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
          ::begin((vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
                   *)in_stack_ffffffffffffffa8);
  in_RDI[1]._M_current = (Sensor **)iVar2._M_current;
  while( true ) {
    std::
    vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
    ::end((vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
           *)in_stack_ffffffffffffffa8);
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffb0,
                       (__normal_iterator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_*,_std::vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>_>
                        *)in_stack_ffffffffffffffa8);
    uVar4 = false;
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_*,_std::vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>_>
      ::operator->((__normal_iterator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_*,_std::vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>_>
                    *)(in_RDI + 1));
      uVar4 = std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>::empty
                        ((vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_> *)
                         CONCAT17(uVar4,in_stack_ffffffffffffffc0));
    }
    if ((bool)uVar4 == false) break;
    __gnu_cxx::
    __normal_iterator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_*,_std::vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>_>
    ::operator++((__normal_iterator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_*,_std::vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>_>
                  *)(in_RDI + 1));
  }
  __lhs = (__normal_iterator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_*,_std::vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>_>
           *)(in_RDI + 1);
  std::
  vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
  ::end((vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
         *)in_stack_ffffffffffffffa8);
  bVar1 = __gnu_cxx::operator!=
                    (__lhs,(__normal_iterator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_*,_std::vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>_>
                            *)in_stack_ffffffffffffffa8);
  if (bVar1) {
    __gnu_cxx::
    __normal_iterator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_*,_std::vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>_>
    ::operator->((__normal_iterator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_*,_std::vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>_>
                  *)(in_RDI + 1));
    iVar3 = std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>::begin
                      (in_stack_ffffffffffffffa8);
    in_RDI->_M_current = iVar3._M_current;
  }
  return;
}

Assistant:

SensorsList::Iterator::Iterator(std::vector< std::vector<Sensor *> >&list)
    : iteratingList(list)
    {
        //Start from the beginning
        externalIterator = iteratingList.begin();
        //While external list is empty, skip to the next one
        while (externalIterator != iteratingList.end()
               && externalIterator->empty()) {
            ++externalIterator;
        }
        //if the iterator is still valid assign the internal
        //otherwise the iterator itself is no longer valid
        if (externalIterator != iteratingList.end()) {
            internalIterator = externalIterator->begin();
        }
    }